

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

void Gia_Iso2ManPrepare(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = 0;
  while ((iVar5 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar5), pGVar3 != (Gia_Obj_t *)0x0))) {
    uVar1 = *(ulong *)pGVar3;
    uVar4 = 0;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      uVar4 = pGVar3[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)].Value;
      if ((int)pGVar3[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)].Value <
          (int)pGVar3[-(uVar1 & 0x1fffffff)].Value) {
        uVar4 = pGVar3[-(uVar1 & 0x1fffffff)].Value;
      }
      uVar4 = uVar4 + 1;
    }
    pGVar3->Value = uVar4;
    iVar5 = iVar5 + 1;
  }
  p->pObjs->Value = 0x1b47586d;
  iVar5 = 1;
  while( true ) {
    if (p->nObjs <= iVar5) {
      return;
    }
    pGVar3 = Gia_ManObj(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar4 = (uint)*(ulong *)pGVar3;
    if ((~uVar4 & 0x1fffffff) == 0 || (int)uVar4 < 0) {
      iVar2 = Gia_ObjIsPi(p,pGVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsRo(p,pGVar3);
        if (iVar2 != 0) {
          pGVar3->Value = 0x22924fcd;
        }
      }
      else {
        pGVar3->Value = 0xfbea205c;
      }
    }
    else {
      pGVar3->Value =
           *(int *)((long)s_256Primes +
                   (ulong)((((uVar4 >> 0x1d & 1) != 0) + 0xf5 +
                           (uint)((*(ulong *)pGVar3 >> 0x3d & 1) != 0)) * 4)) +
           s_256Primes[(byte)pGVar3->Value];
    }
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void Gia_Iso2ManPrepare( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_ObjIsAnd(pObj) ? 1 + Abc_MaxInt(Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value) : 0;
    Gia_ManConst0(p)->Value = s_256Primes[ISO_MASK];
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = s_256Primes[pObj->Value & ISO_MASK] + s_256Primes[ISO_MASK - 10 + Gia_ObjFaninC0(pObj) + Gia_ObjFaninC1(pObj)];
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-1];
        else if ( Gia_ObjIsRo(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-2];
}